

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O1

void __thiscall ear::OutputGainsT<double>::zero(OutputGainsT<double> *this)

{
  pointer __s;
  pointer pdVar1;
  
  __s = (this->vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (this->vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,((long)pdVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
    return;
  }
  return;
}

Assistant:

virtual void zero() override { std::fill(vec.begin(), vec.end(), (T)0.0); }